

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O2

void __thiscall KDReports::ReportPrivate::debugLayoutToPdf(ReportPrivate *this,char *fileName)

{
  char cVar1;
  QPrinter printer;
  QArrayDataPointer<char16_t> local_78;
  QFile html;
  QString htmlText;
  QArrayDataPointer<char16_t> local_38;
  
  QFile::decodeName((char *)0x126b1d);
  local_78.d = (Data *)0x0;
  local_78.ptr = L".html";
  local_78.size = 5;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  operator+((QString *)&printer,&htmlText,(QString *)&local_78);
  QFile::QFile(&html,(QString *)&printer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&printer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&htmlText.d);
  cVar1 = QFile::open(&html,2);
  if (cVar1 != '\0') {
    (*this->m_layout->_vptr_AbstractReportLayout[0x13])(&htmlText);
    QString::toUtf8_helper((QString *)&printer);
    QIODevice::write((QByteArray *)&html);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&printer);
    QFileDevice::close();
    this->m_pageContentSizeDirty = false;
    QPrinter::QPrinter(&printer,0);
    Report::setupPrinter(this->q,&printer);
    QFile::decodeName((char *)0x126c08);
    QPrinter::setOutputFileName((QString *)&printer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    doPrint(this,&printer,(QWidget *)0x0);
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QPrinter::setOutputFileName((QString *)&printer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    this->m_pageContentSizeDirty = true;
    QPrinter::~QPrinter(&printer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&htmlText.d);
    QFile::~QFile(&html);
    return;
  }
  qt_assert("html.open(QIODevice::WriteOnly)",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
            ,0x192);
}

Assistant:

void KDReports::ReportPrivate::debugLayoutToPdf(const char *fileName)
{
    // for calling from gdb

    QFile html(QFile::decodeName(fileName) + QStringLiteral(".html"));
    Q_ASSERT(html.open(QIODevice::WriteOnly));
    const QString htmlText = m_layout->toHtml();
    html.write(htmlText.toUtf8());
    html.close();

    bool oldLayoutDirty = true;
    m_pageContentSizeDirty = false;
    QPrinter printer;
    q->setupPrinter(&printer);
    printer.setOutputFileName(QFile::decodeName(fileName));
    doPrint(&printer, nullptr);
    printer.setOutputFileName(QString());
    m_pageContentSizeDirty = oldLayoutDirty;
}